

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O0

bool __thiscall manual_course::next(manual_course *this)

{
  type piVar1;
  int local_1c;
  int i;
  manual_course *this_local;
  
  local_1c = this->length;
  while( true ) {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return false;
    }
    piVar1 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->iterators,(long)local_1c);
    if (*piVar1 + 1 < this->length) break;
    piVar1 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->iterators,(long)local_1c);
    *piVar1 = 0;
  }
  piVar1 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->iterators,(long)local_1c);
  *piVar1 = *piVar1 + 1;
  return true;
}

Assistant:

bool next()
    {
        for (int i = length - 1; i >= 0; --i) {
            if (iterators[i] + 1 >= length) {
                iterators[i] = 0;
            } else {
                ++iterators[i];
                return true;
            }
        }

        return false;
    }